

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-init.c
# Opt level: O3

void borg_reinit_options(void)

{
  key_mode = (wchar_t)(player->opts).opt[1];
  option_set("rogue_like_commands",0);
  option_set("auto_more",0);
  option_set("pickup_always",1);
  option_set("pickup_detail",0);
  option_set("use_old_target",0);
  option_set("pickup_inven",1);
  option_set("show_piles",0);
  option_set("show_labels",0);
  option_set("show_flavors",0);
  option_set("easy_open",0);
  option_set("easy_alter",0);
  (player->opts).hitpoint_warn = '\0';
  return;
}

Assistant:

void borg_reinit_options(void)
{
    /* Save current key mode */
    key_mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE
                                                : KEYMAP_MODE_ORIG;

    /* The Borg uses the original keypress codes */
    option_set("rogue_like_commands", false);

    /* No auto_more */
    option_set("auto_more", false);

    /* We pick up items when we step on them */
    option_set("pickup_always", true);

    /* We do not want verbose messages */
    option_set("pickup_detail", false);

    /* We specify targets by hand */
    option_set("use_old_target", false);

    /* We must pick items up without verification */
    option_set("pickup_inven", true);

    /* Pile symbol '&' confuse the borg */
    option_set("show_piles", false);

    /* We need space */
    option_set("show_labels", false);

    /* flavors are confusing */
    option_set("show_flavors", false);

    /* The "easy" options confuse the Borg */
    option_set("easy_open", false);
    option_set("easy_alter", false);

    /* Efficiency */
    player->opts.hitpoint_warn = 0;
}